

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_iTXt(png_structrp png_ptr,int compression,png_const_charp key,png_const_charp lang,
                   png_const_charp lang_key,png_const_charp text)

{
  uint prefix_len;
  png_uint_32 pVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *error_message;
  uint uVar5;
  size_t length;
  size_t length_00;
  png_byte new_key [82];
  compression_state comp;
  png_byte local_4a8 [96];
  compression_state local_448;
  
  pVar1 = png_check_keyword(png_ptr,key,local_4a8);
  if (pVar1 == 0) {
    error_message = "iTXt: invalid keyword";
  }
  else {
    uVar5 = compression + 1;
    if (3 < uVar5) {
      png_error(png_ptr,"iTXt: invalid compression");
    }
    local_4a8[pVar1 + 1] = (png_byte)(0x1000100 >> ((char)uVar5 * '\b' & 0x1fU));
    local_4a8[pVar1 + 2] = '\0';
    if (lang == (png_const_charp)0x0) {
      lang = "";
    }
    sVar4 = strlen(lang);
    length = sVar4 + 1;
    if (lang_key == (png_const_charp)0x0) {
      lang_key = "";
    }
    sVar4 = strlen(lang_key);
    length_00 = sVar4 + 1;
    if (text == (png_const_charp)0x0) {
      text = "";
    }
    uVar2 = pVar1 + 3 + (int)length;
    if (0x7ffffffc - pVar1 < length) {
      uVar2 = 0x7fffffff;
    }
    prefix_len = (int)length_00 + uVar2;
    if ((uVar2 ^ 0x7fffffff) < length_00) {
      prefix_len = 0x7fffffff;
    }
    local_448.input_len = strlen(text);
    local_448.output_len = 0;
    local_448.input = (png_const_bytep)text;
    if ((uVar5 & 1) == 0) {
      if (local_448.input_len <= (prefix_len ^ 0x7fffffff)) {
        local_448.output_len = (png_uint_32)local_448.input_len;
        goto LAB_0012214f;
      }
      error_message = "iTXt: uncompressed text too long";
    }
    else {
      iVar3 = png_text_compress(png_ptr,0x69545874,&local_448,prefix_len);
      if (iVar3 == 0) {
LAB_0012214f:
        png_write_chunk_header(png_ptr,0x69545874,prefix_len + local_448.output_len);
        png_write_chunk_data(png_ptr,local_4a8,(ulong)(pVar1 + 3));
        png_write_chunk_data(png_ptr,(png_const_bytep)lang,length);
        png_write_chunk_data(png_ptr,(png_const_bytep)lang_key,length_00);
        if ((uVar5 & 1) == 0) {
          png_write_chunk_data(png_ptr,(png_const_bytep)text,(ulong)local_448.output_len);
        }
        else {
          png_write_compressed_data_out(png_ptr,&local_448);
        }
        png_write_chunk_end(png_ptr);
        return;
      }
      error_message = (png_ptr->zstream).msg;
    }
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_iTXt(png_structrp png_ptr, int compression, png_const_charp key,
    png_const_charp lang, png_const_charp lang_key, png_const_charp text)
{
   png_uint_32 key_len, prefix_len;
   size_t lang_len, lang_key_len;
   png_byte new_key[82];
   compression_state comp;

   png_debug(1, "in png_write_iTXt");

   key_len = png_check_keyword(png_ptr, key, new_key);

   if (key_len == 0)
      png_error(png_ptr, "iTXt: invalid keyword");

   /* Set the compression flag */
   switch (compression)
   {
      case PNG_ITXT_COMPRESSION_NONE:
      case PNG_TEXT_COMPRESSION_NONE:
         compression = new_key[++key_len] = 0; /* no compression */
         break;

      case PNG_TEXT_COMPRESSION_zTXt:
      case PNG_ITXT_COMPRESSION_zTXt:
         compression = new_key[++key_len] = 1; /* compressed */
         break;

      default:
         png_error(png_ptr, "iTXt: invalid compression");
   }

   new_key[++key_len] = PNG_COMPRESSION_TYPE_BASE;
   ++key_len; /* for the keywod separator */

   /* We leave it to the application to meet PNG-1.0 requirements on the
    * contents of the text.  PNG-1.0 through PNG-1.2 discourage the use of
    * any non-Latin-1 characters except for NEWLINE.  ISO PNG, however,
    * specifies that the text is UTF-8 and this really doesn't require any
    * checking.
    *
    * The NUL character is forbidden by PNG-1.0 through PNG-1.2 and ISO PNG.
    *
    * TODO: validate the language tag correctly (see the spec.)
    */
   if (lang == NULL) lang = ""; /* empty language is valid */
   lang_len = strlen(lang)+1;
   if (lang_key == NULL) lang_key = ""; /* may be empty */
   lang_key_len = strlen(lang_key)+1;
   if (text == NULL) text = ""; /* may be empty */

   prefix_len = key_len;
   if (lang_len > PNG_UINT_31_MAX-prefix_len)
      prefix_len = PNG_UINT_31_MAX;
   else
      prefix_len = (png_uint_32)(prefix_len + lang_len);

   if (lang_key_len > PNG_UINT_31_MAX-prefix_len)
      prefix_len = PNG_UINT_31_MAX;
   else
      prefix_len = (png_uint_32)(prefix_len + lang_key_len);

   png_text_compress_init(&comp, (png_const_bytep)text, strlen(text));

   if (compression != 0)
   {
      if (png_text_compress(png_ptr, png_iTXt, &comp, prefix_len) != Z_OK)
         png_error(png_ptr, png_ptr->zstream.msg);
   }

   else
   {
      if (comp.input_len > PNG_UINT_31_MAX-prefix_len)
         png_error(png_ptr, "iTXt: uncompressed text too long");

      /* So the string will fit in a chunk: */
      comp.output_len = (png_uint_32)/*SAFE*/comp.input_len;
   }

   png_write_chunk_header(png_ptr, png_iTXt, comp.output_len + prefix_len);

   png_write_chunk_data(png_ptr, new_key, key_len);

   png_write_chunk_data(png_ptr, (png_const_bytep)lang, lang_len);

   png_write_chunk_data(png_ptr, (png_const_bytep)lang_key, lang_key_len);

   if (compression != 0)
      png_write_compressed_data_out(png_ptr, &comp);

   else
      png_write_chunk_data(png_ptr, (png_const_bytep)text, comp.output_len);

   png_write_chunk_end(png_ptr);
}